

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmarkdowntextedit.cpp
# Opt level: O0

void __thiscall QMarkdownTextEdit::openUrl(QMarkdownTextEdit *this,QString *urlString)

{
  QDebug *pQVar1;
  QUrl local_58 [24];
  QMessageLogger local_40;
  QDebug local_20;
  QString *local_18;
  QString *urlString_local;
  QMarkdownTextEdit *this_local;
  
  local_18 = urlString;
  urlString_local = (QString *)this;
  QMessageLogger::QMessageLogger(&local_40,(char *)0x0,0,(char *)0x0);
  QMessageLogger::debug();
  pQVar1 = QDebug::operator<<(&local_20,"QMarkdownTextEdit ");
  pQVar1 = QDebug::operator<<(pQVar1,"openUrl");
  pQVar1 = QDebug::operator<<(pQVar1," - \'urlString\': ");
  QDebug::operator<<(pQVar1,local_18);
  QDebug::~QDebug(&local_20);
  QUrl::QUrl(local_58,local_18,0);
  QDesktopServices::openUrl(local_58);
  QUrl::~QUrl(local_58);
  return;
}

Assistant:

void QMarkdownTextEdit::openUrl(const QString &urlString) {
    qDebug() << "QMarkdownTextEdit " << __func__
             << " - 'urlString': " << urlString;

    QDesktopServices::openUrl(QUrl(urlString));
}